

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  MetaCommandResult MVar1;
  PrepareResult PVar2;
  ExecuteResult EVar3;
  Table *this;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  string input;
  Statement st;
  char *local_118;
  long local_110;
  char local_108 [16];
  string local_f8;
  string local_d8;
  string local_b8;
  Statement local_98;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"2nd arg not provided.\n",0x16);
    return 1;
  }
  local_118 = local_108;
  local_110 = 0;
  local_108[0] = '\0';
  this = (Table *)operator_new(0x10);
  Table::Table(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,argv[1],(allocator<char> *)&local_98);
  Table::dbOpen(this,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
LAB_0010296e:
  while( true ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"db > ",5);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_118);
    if (*local_118 != '.') break;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_118,local_118 + local_110);
    MVar1 = runCommand(&local_f8,this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (MVar1 == CommandSuccess) break;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unrecognized command!\n",0x16);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_118,local_118 + local_110);
  PVar2 = Statement::prepareStatement(&local_98,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  switch(PVar2) {
  case PrepareUnrecognized:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unrecognized Statement in ",0x1a);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_118,local_110);
    std::endl<char,std::char_traits<char>>(poVar4);
    goto LAB_0010296e;
  case PrepareSyntaxError:
    lVar5 = 0x29;
    pcVar6 = "Syntax error. Could not parse statement.\n";
    break;
  case PrepareStringTooLong:
    lVar5 = 0x10;
    pcVar6 = "String too long\n";
    break;
  case PrepareNegativeId:
    lVar5 = 0x19;
    pcVar6 = "Negative Id not allowed!\n";
    break;
  default:
    EVar3 = Statement::executeStatement(&local_98,this);
    if (EVar3 == ExecuteSucess) {
      lVar5 = 9;
      pcVar6 = "Executed\n";
    }
    else {
      if (EVar3 != ExecuteDuplicateKey) goto LAB_0010296e;
      lVar5 = 0x1b;
      pcVar6 = "Duplicate keys not allowed\n";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
  goto LAB_0010296e;
}

Assistant:

int main(int argc, char *argv[]) {
	if (argc < 2) {
		std::cout << "2nd arg not provided.\n";
		return 1;
	}
	std::string input;
	Table *table = new Table;
	table->dbOpen(argv[1]);

	while(true) {
		printPrompt();
		getline(std::cin, input);

		if (input[0] == '.') {
			switch(runCommand(input, table)) {
				case MetaCommandResult::CommandSuccess:
				break;
				case MetaCommandResult::CommandUnrecognized:
				std::cout << "Unrecognized command!\n";
                continue;
			}
		}

		Statement st;
		auto prepareResult = st.prepareStatement(input);
		switch(prepareResult) {
			case PrepareSuccess:
				break;
			case PrepareSyntaxError:
				std::cout << "Syntax error. Could not parse statement.\n";
                continue;
			case PrepareStringTooLong:
				std::cout << "String too long\n";
                continue;
			case PrepareNegativeId:
				std::cout << "Negative Id not allowed!\n";
				continue;
			case PrepareUnrecognized:
				std::cout << "Unrecognized Statement in " << input << std::endl;
				continue;
		}

		switch(st.executeStatement(table)) {
			case ExecuteSucess:
				std::cout << "Executed\n";
				break;
			case ExecuteDuplicateKey:
				std::cout << "Duplicate keys not allowed\n";
				break;
			case ExecuteTableFull:
				break;
		}
	}

	return 0;
}